

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

int __thiscall QSQLiteDriver::close(QSQLiteDriver *this,int __fd)

{
  bool bVar1;
  int iVar2;
  QSQLiteDriverPrivate *pQVar3;
  ulong uVar4;
  QSQLiteResult **ppQVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  int res;
  QSQLiteResult *result;
  add_const_t<QList<QSQLiteResult_*>_> *__range2;
  QSQLiteDriverPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  sqlite3 *in_stack_ffffffffffffffa0;
  QSQLiteDriver *descr;
  sqlite3 *in_stack_ffffffffffffffc0;
  QSqlError local_28 [8];
  QSQLiteResult **local_20;
  const_iterator local_18;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  descr = this;
  pQVar3 = d_func((QSQLiteDriver *)0x1183ea);
  uVar4 = (**(code **)(*(long *)&((QSQLiteResultPrivate *)this)->super_QSqlCachedResultPrivate +
                      0x60))();
  if ((uVar4 & 1) != 0) {
    local_10.i = (QSQLiteResult **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QSQLiteResult_*>::begin((QList<QSQLiteResult_*> *)this);
    local_18.i = (QSQLiteResult **)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QList<QSQLiteResult_*>::end((QList<QSQLiteResult_*> *)this);
    while( true ) {
      local_20 = local_18.i;
      bVar1 = QList<QSQLiteResult_*>::const_iterator::operator!=(&local_10,local_18);
      if (!bVar1) break;
      ppQVar5 = QList<QSQLiteResult_*>::const_iterator::operator*(&local_10);
      in_stack_ffffffffffffffa0 = (sqlite3 *)*ppQVar5;
      QSQLiteResult::d_func((QSQLiteResult *)0x118493);
      QSQLiteResultPrivate::finalize((QSQLiteResultPrivate *)this);
      QList<QSQLiteResult_*>::const_iterator::operator++(&local_10);
    }
    if ((pQVar3->access != (sqlite3 *)0x0) &&
       (qVar6 = QList<QString>::size(&pQVar3->notificationid), 0 < qVar6)) {
      QList<QString>::clear((QList<QString> *)this);
      sqlite3_update_hook(in_stack_ffffffffffffffa0,
                          (_func_void_void_ptr_int_char_ptr_char_ptr_sqlite_int64 *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),this);
    }
    iVar2 = sqlite3_close((sqlite3 *)0x118507);
    if (iVar2 != 0) {
      tr((char *)CONCAT44(iVar2,in_stack_ffffffffffffff98),(char *)this,
         (int)((ulong)pQVar3->access >> 0x20));
      qMakeError(in_stack_ffffffffffffffc0,(QString *)descr,(ErrorType)((ulong)pQVar3 >> 0x20),
                 (int)pQVar3);
      (**(code **)(*(long *)&((QSQLiteResultPrivate *)this)->super_QSqlCachedResultPrivate + 0x120))
                (this,local_28);
      QSqlError::~QSqlError(local_28);
      QString::~QString((QString *)0x118580);
    }
    pQVar3->access = (sqlite3 *)0x0;
    (**(code **)(*(long *)&((QSQLiteResultPrivate *)this)->super_QSqlCachedResultPrivate + 0x110))
              (this,0);
    (**(code **)(*(long *)&((QSQLiteResultPrivate *)this)->super_QSqlCachedResultPrivate + 0x118))
              (this,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QSQLiteDriver::close()
{
    Q_D(QSQLiteDriver);
    if (isOpen()) {
        for (QSQLiteResult *result : std::as_const(d->results))
            result->d_func()->finalize();

        if (d->access && (d->notificationid.size() > 0)) {
            d->notificationid.clear();
            sqlite3_update_hook(d->access, nullptr, nullptr);
        }

        const int res = sqlite3_close(d->access);

        if (res != SQLITE_OK)
            setLastError(qMakeError(d->access, tr("Error closing database"), QSqlError::ConnectionError, res));
        d->access = nullptr;
        setOpen(false);
        setOpenError(false);
    }
}